

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O1

void com_get_nbr_l(pel *dst,int ipm,int ipf,int x,int y,int width,int height,pel *srcT,pel *srcL,
                  int s_src,u16 avail_cu,int scup,com_scu_t *map_scu,int i_scu,int bit_depth)

{
  pel *ppVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  pel *ppVar7;
  com_scu_t *pcVar8;
  int iVar9;
  uint uVar10;
  uint __c;
  
  __c = 1 << ((char)bit_depth - 1U & 0x1f);
  iVar2 = height;
  if (height < width) {
    iVar2 = width;
  }
  iVar9 = iVar2 * 2 + 4;
  if (ipm < 0x18 || ipf != 0) {
    ppVar1 = dst + 1;
    if ((avail_cu & 1) == 0) {
      memset(ppVar1,__c,(long)iVar9);
    }
    else {
      uVar10 = width >> 2;
      sVar3 = (size_t)width;
      memcpy(ppVar1,srcT,sVar3);
      ppVar1 = ppVar1 + sVar3;
      if ((int)uVar10 < 1) {
        iVar5 = 0;
      }
      else {
        lVar4 = 0;
        do {
          if (((byte)map_scu[lVar4 + (ulong)uVar10 + ((long)scup - (long)i_scu)] & 1) == 0) {
            uVar10 = (uint)lVar4;
            break;
          }
          *(undefined4 *)ppVar1 = *(undefined4 *)(srcT + lVar4 * 4 + sVar3);
          ppVar1 = ppVar1 + 4;
          lVar4 = lVar4 + 1;
        } while (uVar10 != (uint)lVar4);
        iVar5 = uVar10 << 2;
      }
      memset(ppVar1,(uint)ppVar1[-1],(long)(iVar9 - (iVar5 + width)));
    }
  }
  if (ipm - 0xdU < 0xfffffff6 || ipf != 0) {
    ppVar1 = dst + -1;
    if ((avail_cu & 2) == 0) {
      ppVar7 = ppVar1 + (long)(iVar2 * -2 + -4) + 1;
      sVar3 = (size_t)iVar9;
      uVar10 = __c;
    }
    else {
      iVar2 = height >> 2;
      lVar4 = (long)s_src;
      ppVar7 = srcL;
      if (0 < height) {
        iVar5 = 0;
        do {
          *ppVar1 = *ppVar7;
          ppVar1[-1] = ppVar7[lVar4];
          ppVar1[-2] = ppVar7[lVar4 * 2];
          ppVar1[-3] = ppVar7[lVar4 * 3];
          ppVar1 = ppVar1 + -4;
          ppVar7 = ppVar7 + lVar4 * 4;
          iVar5 = iVar5 + 4;
        } while (iVar5 < height);
      }
      if (iVar2 < 1) {
        iVar5 = 0;
      }
      else {
        pcVar8 = map_scu + (long)(iVar2 * i_scu) + (long)scup + -1;
        iVar6 = 0;
        do {
          iVar5 = iVar6;
          if (((byte)*pcVar8 & 1) == 0) break;
          *ppVar1 = *ppVar7;
          ppVar1[-1] = ppVar7[lVar4];
          ppVar1[-2] = ppVar7[lVar4 * 2];
          ppVar1[-3] = ppVar7[lVar4 * 3];
          ppVar1 = ppVar1 + -4;
          ppVar7 = ppVar7 + lVar4 * 4;
          iVar6 = iVar6 + 1;
          pcVar8 = pcVar8 + i_scu;
          iVar5 = iVar2;
        } while (iVar2 != iVar6);
        iVar5 = iVar5 << 2;
      }
      sVar3 = (size_t)(iVar9 - (iVar5 + height));
      ppVar7 = ppVar1 + (1 - sVar3);
      uVar10 = (uint)ppVar1[1];
    }
    memset(ppVar7,uVar10,sVar3);
  }
  if ((avail_cu & 4) == 0) {
    if ((avail_cu & 1) == 0) {
      if ((avail_cu & 2) != 0) {
        __c = (uint)*srcL;
      }
    }
    else {
      __c = (uint)*srcT;
    }
  }
  else {
    __c = (uint)srcT[-1];
  }
  *dst = (pel)__c;
  return;
}

Assistant:

void com_get_nbr_l(pel *dst, int ipm, int ipf, int x, int y, int width, int height, pel *srcT, pel *srcL, int s_src, u16 avail_cu, int scup, com_scu_t * map_scu, int i_scu, int bit_depth)
{
    int  i;
    int  width_in_scu = width >> MIN_CU_LOG2;
    int  height_in_scu = height >> MIN_CU_LOG2;
    pel *srcTL = srcT - 1;
    pel *left = dst - 1;
    pel *up = dst + 1;

    int pad_le_in_scu = height_in_scu;
    int pad_up_in_scu = width_in_scu;
    int default_val = 1 << (bit_depth - 1);
    int pad_range = COM_MAX(width, height) * 2 + 4;

    if (ipm < IPD_HOR || ipf) {
        if (IS_AVAIL(avail_cu, AVAIL_UP)) {
            com_scu_t *map_up_scu = map_scu + scup - i_scu + width_in_scu;
         
            memcpy(up, srcT, width * sizeof(pel));
            up += width, srcT += width;

            for (i = 0; i < pad_up_in_scu; i++, up += MIN_CU_SIZE, srcT += MIN_CU_SIZE) {
                if ((map_up_scu++)->coded) {
                    com_mcpy_4pel(up, srcT);
                } else {
                    break;
                }
            }
            com_mset_pel(up, up[-1], pad_range - (width + i * MIN_CU_SIZE));
        } else {
            com_mset_pel(up, default_val, pad_range);
        }
    }
    if (ipm <= IPD_BI || ipm > IPD_VER || ipf) {
        if (IS_AVAIL(avail_cu, AVAIL_LE)) {
            com_scu_t *map_left_scu = map_scu + scup - 1 + height_in_scu * i_scu;
            pel *src = srcL;

            for (i = 0; i < height; i += 4) {
                *left-- = *src;
                src += s_src;
                *left-- = *src;
                src += s_src;
                *left-- = *src;
                src += s_src;
                *left-- = *src;
                src += s_src;
            }
            for (i = 0; i < pad_le_in_scu; i++, map_left_scu += i_scu) {
                if (map_left_scu->coded) {
                    *left-- = *src;
                    src += s_src;
                    *left-- = *src;
                    src += s_src;
                    *left-- = *src;
                    src += s_src;
                    *left-- = *src;
                    src += s_src;
                } else {
                    break;
                }
            }
            int pads = pad_range - height - i * MIN_CU_SIZE;
            com_mset_pel(left - pads + 1, left[1], pads);
        } else {
            com_mset_pel(left - pad_range + 1, default_val, pad_range);
        }
    }

    if (IS_AVAIL(avail_cu, AVAIL_UL)) {
        dst[0] = srcTL[0];
    } else if (IS_AVAIL(avail_cu, AVAIL_UP)) {
        dst[0] = srcTL[1];
    } else if (IS_AVAIL(avail_cu, AVAIL_LE)) {
        dst[0] = srcL[0];
    } else {
        dst[0] = default_val;
    }
}